

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O2

Aig_Man_t * Saig_ManCreateIndMiter2(Aig_Man_t *pAig,Vec_Vec_t *vCands)

{
  size_t __nmemb;
  Aig_Obj_t **pObjMap;
  Aig_Man_t *p;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  __nmemb = (long)pAig->vObjs->nSize * 3;
  pObjMap = (Aig_Obj_t **)calloc(__nmemb,8);
  p = Aig_ManStart((int)__nmemb);
  pcVar1 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(pAig->pSpec);
  p->pSpec = pcVar1;
  iVar9 = pAig->pConst1->Id;
  pAVar3 = p->pConst1;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    pObjMap[iVar9 * 3 + lVar6] = pAVar3;
  }
  for (iVar9 = 0; iVar9 != 3; iVar9 = iVar9 + 1) {
    for (iVar7 = 0; iVar7 < pAig->nObjs[2] - pAig->nRegs; iVar7 = iVar7 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,iVar7);
      pAVar3 = Aig_ObjCreateCi(p);
      pObjMap[(long)*(int *)((long)pvVar2 + 0x24) * 3 + (long)iVar9] = pAVar3;
    }
  }
  for (iVar9 = pAig->nObjs[2] - pAig->nRegs; iVar9 < pAig->vCis->nSize; iVar9 = iVar9 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,iVar9);
    pAVar3 = Aig_ObjCreateCi(p);
    pObjMap[(long)*(int *)((long)pvVar2 + 0x24) * 3] = pAVar3;
  }
  iVar9 = 0;
  while (iVar9 != 3) {
    for (iVar7 = 0; iVar7 < pAig->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar7);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        pAVar4 = Aig_ObjChild0Frames(pObjMap,3,pAVar3,iVar9);
        pAVar5 = Aig_ObjChild1Frames(pObjMap,3,pAVar3,iVar9);
        pAVar4 = Aig_And(p,pAVar4,pAVar5);
        pObjMap[(long)pAVar3->Id * 3 + (long)iVar9] = pAVar4;
      }
    }
    lVar6 = (long)iVar9 + 1;
    for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
      pAVar3 = Aig_ManLi(pAig,iVar7);
      pAVar4 = Aig_ManLo(pAig,iVar7);
      if (iVar9 != 2) {
        pAVar3 = Aig_ObjChild0Frames(pObjMap,3,pAVar3,iVar9);
        pObjMap[(long)pAVar4->Id * 3 + lVar6] = pAVar3;
      }
    }
    iVar9 = (int)lVar6;
  }
  for (iVar9 = 0; iVar9 < vCands->nSize; iVar9 = iVar9 + 1) {
    p_00 = Vec_VecEntry(vCands,iVar9);
    for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
      pvVar2 = Vec_PtrEntry(p_00,iVar7);
      lVar6 = (long)*(int *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x24);
      pAVar3 = pObjMap[lVar6 * 3 + 1];
      uVar8 = (ulong)((uint)pvVar2 & 1);
      pAVar5 = (Aig_Obj_t *)((ulong)pObjMap[lVar6 * 3] ^ uVar8);
      pAVar4 = Aig_And(p,pAVar5,(Aig_Obj_t *)(uVar8 ^ 1 ^ (ulong)pAVar3));
      Aig_ObjCreateCo(p,pAVar4);
      pAVar3 = (Aig_Obj_t *)(uVar8 ^ (ulong)pAVar3);
      pAVar4 = Aig_And(p,pAVar5,pAVar3);
      Aig_ObjCreateCo(p,pAVar4);
      pAVar4 = pObjMap[(long)*(int *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x24) * 3 + 2];
      pAVar3 = Aig_And(p,pAVar5,pAVar3);
      pAVar3 = Aig_And(p,pAVar3,(Aig_Obj_t *)(uVar8 ^ 1 ^ (ulong)pAVar4));
      Aig_ObjCreateCo(p,pAVar3);
    }
  }
  Aig_ManCleanup(p);
  free(pObjMap);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateIndMiter2( Aig_Man_t * pAig, Vec_Vec_t * vCands )
{
  int nFrames = 3;
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f, k;

    // create mapping for the frames nodes
    pObjMap  = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    
    // go through the candidates
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Aig_Obj_t * pObjR  = Aig_Regular(pObj);
            Aig_Obj_t * pNode0 = pObjMap[nFrames*Aig_ObjId(pObjR)+0];
            Aig_Obj_t * pNode1 = pObjMap[nFrames*Aig_ObjId(pObjR)+1];
	    {
	      Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan1  = Aig_NotCond( pNode1, !Aig_IsComplement(pObj) );
	      Aig_Obj_t * pMiter = Aig_And( pFrames, pFan0, pFan1 );
	      Aig_ObjCreateCo( pFrames, pMiter );
	    
	    /* need to check p & Xp is satisfiable */
	    /* jlong -- begin */
          {
	      Aig_Obj_t * pMiter2 = Aig_And( pFrames, pFan0, Aig_Not(pFan1));
	      Aig_ObjCreateCo( pFrames, pMiter2 ); 
          }
        /* jlong -- end  */
	    }

	    {			/* jlong -- begin */
	      Aig_Obj_t * pNode2 = pObjMap[nFrames*Aig_ObjId(pObjR)+2];
	      Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan1  = Aig_NotCond( pNode1,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan2  = Aig_NotCond( pNode2, !Aig_IsComplement(pObj) );
	      Aig_Obj_t * pMiter = Aig_And( pFrames, Aig_And(pFrames, pFan0, pFan1 ), pFan2);
	      Aig_ObjCreateCo( pFrames, pMiter ); /* jlong -- end  */
	    }

        }
    }
    Aig_ManCleanup( pFrames );
    ABC_FREE( pObjMap );

//Aig_ManShow( pAig, 0, NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}